

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

bool Js::JavascriptOperators::PatchInitValueCantChangeType<Js::InlineCache>
               (FunctionBody *functionBody,InlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,RecyclableObject *object,PropertyId propertyId,
               Var newValue)

{
  Type *pTVar1;
  bool bVar2;
  DynamicObject *pDVar3;
  
  bVar2 = VarIsImpl<Js::DynamicObject>(object);
  if (bVar2) {
    pDVar3 = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(object);
    pTVar1 = (pDVar3->super_RecyclableObject).type.ptr;
    PatchInitValue<true,Js::InlineCache>
              (functionBody,inlineCache,inlineCacheIndex,object,propertyId,newValue);
    if (pTVar1 != (Type *)0x0) {
      pDVar3 = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(object);
      return pTVar1 != (pDVar3->super_RecyclableObject).type.ptr;
    }
  }
  else {
    PatchInitValue<true,Js::InlineCache>
              (functionBody,inlineCache,inlineCacheIndex,object,propertyId,newValue);
  }
  return false;
}

Assistant:

inline bool JavascriptOperators::PatchInitValueCantChangeType(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, RecyclableObject* object, PropertyId propertyId, Var newValue)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchInitValueCantChangeType);
        JIT_HELPER_SAME_ATTRIBUTES(Op_PatchInitValueCantChangeType, Op_PatchInitValue);

        Type * oldType = VarIs<DynamicObject>(object) ? UnsafeVarTo<DynamicObject>(object)->GetType() : nullptr;
        PatchInitValue<true, TInlineCache>(functionBody, inlineCache, inlineCacheIndex, object, propertyId, newValue);
        return (oldType != nullptr && oldType != UnsafeVarTo<DynamicObject>(object)->GetType());

        JIT_HELPER_END(Op_PatchInitValueCantChangeType);
    }